

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::ES5ArrayTypeHandlerBase<int>::SetItemAttributes
          (ES5ArrayTypeHandlerBase<int> *this,ES5Array *arr,DynamicObject *instance,uint32 index,
          PropertyAttributes attributes)

{
  code *pcVar1;
  uint32 key;
  bool bVar2;
  byte bVar3;
  BOOL BVar4;
  IndexPropertyDescriptorMap *pIVar5;
  undefined4 *puVar6;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *pPVar7;
  undefined1 local_60 [32];
  undefined1 local_40 [16];
  IndexPropertyDescriptor *descriptor;
  PropertyAttributes attributes_local;
  Type TStack_28;
  uint32 index_local;
  DynamicObject *instance_local;
  ES5Array *arr_local;
  ES5ArrayTypeHandlerBase<int> *this_local;
  
  descriptor._3_1_ = attributes;
  descriptor._4_4_ = index;
  TStack_28.ptr = (RuntimeFunction *)instance;
  instance_local = (DynamicObject *)arr;
  arr_local = (ES5Array *)this;
  pIVar5 = Memory::WriteBarrierPtr<Js::IndexPropertyDescriptorMap>::operator->
                     (&this->indexPropertyMap);
  bVar2 = IndexPropertyDescriptorMap::TryGetReference
                    (pIVar5,descriptor._4_4_,(IndexPropertyDescriptor **)(local_40 + 8));
  if (bVar2) {
    if (((ulong)(((RootObjectBase *)local_40._8_8_)->super_DynamicObject).super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject &
        8) == 0) {
      bVar2 = DynamicObject::GetHasNoEnumerableProperties(instance_local);
      if (bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/ES5ArrayTypeHandler.cpp"
                                    ,0x224,"(!arr->GetHasNoEnumerableProperties())",
                                    "!arr->GetHasNoEnumerableProperties()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      *(byte *)&(((RootObjectBase *)local_40._8_8_)->super_DynamicObject).super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
           *(byte *)&(((RootObjectBase *)local_40._8_8_)->super_DynamicObject).
                     super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                     _vptr_IRecyclerVisitedObject & 0xf8 | descriptor._3_1_ & 7;
      if (((ulong)(((RootObjectBase *)local_40._8_8_)->super_DynamicObject).super_RecyclableObject.
                  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
          & 4) == 0) {
        DynamicTypeHandler::ClearHasOnlyWritableDataProperties((DynamicTypeHandler *)this);
        bVar3 = DynamicTypeHandler::GetFlags((DynamicTypeHandler *)this);
        if ((bVar3 & 0x20) != 0) {
          RecyclableObject::GetLibrary((RecyclableObject *)TStack_28.ptr);
          JavascriptLibrary::GetTypesWithOnlyWritablePropertyProtoChainCache
                    ((JavascriptLibrary *)local_40);
          pPVar7 = Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>
                   ::operator->((WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>
                                 *)local_40);
          PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear(pPVar7);
        }
      }
      this_local._4_4_ = 1;
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  else {
    BVar4 = HasDataItem(this,(ES5Array *)instance_local,descriptor._4_4_);
    if (BVar4 == 0) {
      this_local._4_4_ = 0;
    }
    else {
      bVar2 = DynamicObject::GetHasNoEnumerableProperties(instance_local);
      if (bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/ES5ArrayTypeHandler.cpp"
                                    ,0x234,"(!arr->GetHasNoEnumerableProperties())",
                                    "!arr->GetHasNoEnumerableProperties()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      pIVar5 = Memory::WriteBarrierPtr<Js::IndexPropertyDescriptorMap>::operator->
                         (&this->indexPropertyMap);
      key = descriptor._4_4_;
      IndexPropertyDescriptor::IndexPropertyDescriptor
                ((IndexPropertyDescriptor *)(local_60 + 8),descriptor._3_1_ & 7,(Var)0x0,(Var)0x0);
      IndexPropertyDescriptorMap::Add(pIVar5,key,(IndexPropertyDescriptor *)(local_60 + 8));
      if ((descriptor._3_1_ & 4) == 0) {
        DynamicTypeHandler::ClearHasOnlyWritableDataProperties((DynamicTypeHandler *)this);
        bVar3 = DynamicTypeHandler::GetFlags((DynamicTypeHandler *)this);
        if ((bVar3 & 0x20) != 0) {
          RecyclableObject::GetLibrary((RecyclableObject *)TStack_28.ptr);
          JavascriptLibrary::GetTypesWithOnlyWritablePropertyProtoChainCache
                    ((JavascriptLibrary *)local_60);
          pPVar7 = Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>
                   ::operator->((WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>
                                 *)local_60);
          PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear(pPVar7);
        }
      }
      this_local._4_4_ = 1;
    }
  }
  return this_local._4_4_;
}

Assistant:

BOOL ES5ArrayTypeHandlerBase<T>::SetItemAttributes(ES5Array* arr, DynamicObject* instance, uint32 index, PropertyAttributes attributes)
    {
        IndexPropertyDescriptor* descriptor;
        if (indexPropertyMap->TryGetReference(index, &descriptor))
        {
            if (descriptor->Attributes & PropertyDeleted)
            {
                return false;
            }

            // No need to change hasNoEnumerableProperties. See comment in ES5ArrayTypeHandlerBase<T>::SetItemWithAttributes.
            Assert(!arr->GetHasNoEnumerableProperties());

            descriptor->Attributes = (descriptor->Attributes & ~PropertyDynamicTypeDefaults) | (attributes & PropertyDynamicTypeDefaults);
            if (!(descriptor->Attributes & PropertyWritable))
            {
                this->ClearHasOnlyWritableDataProperties();
                if(this->GetFlags() & this->IsPrototypeFlag)
                {
                    instance->GetLibrary()->GetTypesWithOnlyWritablePropertyProtoChainCache()->Clear();
                }
            }
            return true;
        }
        else if (HasDataItem(arr, index))
        {
            // No need to change hasNoEnumerableProperties. See comment in ES5ArrayTypeHandlerBase<T>::SetItemWithAttributes.
            Assert(!arr->GetHasNoEnumerableProperties());

            indexPropertyMap->Add(index, IndexPropertyDescriptor(attributes & PropertyDynamicTypeDefaults));
            if (!(attributes & PropertyWritable))
            {
                this->ClearHasOnlyWritableDataProperties();
                if(this->GetFlags() & this->IsPrototypeFlag)
                {
                    instance->GetLibrary()->GetTypesWithOnlyWritablePropertyProtoChainCache()->Clear();
                }
            }
            return true;
        }

        return false;
    }